

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__fill_bits(stbi__zbuf *z)

{
  byte bVar1;
  stbi__zbuf *in_RDI;
  
  do {
    if ((uint)(1 << ((byte)in_RDI->num_bits & 0x1f)) <= in_RDI->code_buffer) {
      __assert_fail("z->code_buffer < (1U << z->num_bits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                    ,0xf08,"void stbi__fill_bits(stbi__zbuf *)");
    }
    bVar1 = stbi__zget8(in_RDI);
    in_RDI->code_buffer = (uint)bVar1 << ((byte)in_RDI->num_bits & 0x1f) | in_RDI->code_buffer;
    in_RDI->num_bits = in_RDI->num_bits + 8;
  } while (in_RDI->num_bits < 0x19);
  return;
}

Assistant:

static void stbi__fill_bits(stbi__zbuf *z)
{
   do {
      STBI_ASSERT(z->code_buffer < (1U << z->num_bits));
      z->code_buffer |= (unsigned int) stbi__zget8(z) << z->num_bits;
      z->num_bits += 8;
   } while (z->num_bits <= 24);
}